

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRenode.c
# Opt level: O3

int Abc_NtkRenodeEvalMv(If_Man_t *p,If_Cut_t *pCut)

{
  uint *puVar1;
  word *pwVar2;
  Vec_Mem_t *pVVar3;
  uint uVar4;
  int iVar5;
  word *pwVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  
  uVar9 = *(uint *)&pCut->field_0x1c >> 0x18;
  if (0xffffff < *(uint *)&pCut->field_0x1c) {
    memset(&pCut[1].Area + uVar9,1,(ulong)(uVar9 - 1) + 1);
  }
  uVar7 = pCut->iCutFunc;
  if ((int)uVar7 < 0) {
LAB_00301179:
    __assert_fail("pCut->iCutFunc >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                  ,0x1b8,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
  }
  pwVar2 = p->puTempW;
  pVVar3 = p->vTtMem[uVar9];
  if (pVVar3 == (Vec_Mem_t *)0x0) {
    pwVar6 = (word *)0x0;
  }
  else {
    uVar4 = uVar7 >> 1;
    if (pVVar3->nEntries <= (int)uVar4) goto LAB_00301198;
    pwVar6 = pVVar3->ppPages[uVar4 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
             (ulong)(uVar4 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
  }
  uVar9 = p->nTruth6Words[uVar9];
  if ((uVar7 & 1) == 0) {
    if (0 < (int)uVar9) {
      uVar8 = 0;
      do {
        pwVar2[uVar8] = pwVar6[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
  }
  else if (0 < (int)uVar9) {
    uVar8 = 0;
    do {
      pwVar2[uVar8] = ~pwVar6[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
  }
  uVar9 = Kit_TruthIsop((uint *)pwVar2,(uint)(byte)pCut->field_0x1f,s_vMemory,0);
  if (uVar9 != 0xffffffff) {
    if (1 < uVar9) {
      __assert_fail("RetValue == 0 || RetValue == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRenode.c"
                    ,299,"int Abc_NtkRenodeEvalMv(If_Man_t *, If_Cut_t *)");
    }
    uVar9 = pCut->iCutFunc;
    if ((int)uVar9 < 0) goto LAB_00301179;
    pwVar2 = p->puTempW;
    pVVar3 = p->vTtMem[(byte)pCut->field_0x1f];
    if (pVVar3 == (Vec_Mem_t *)0x0) {
      pwVar6 = (word *)0x0;
    }
    else {
      uVar7 = uVar9 >> 1;
      if (pVVar3->nEntries <= (int)uVar7) goto LAB_00301198;
      pwVar6 = pVVar3->ppPages[uVar7 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
               (ulong)(uVar7 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
    }
    uVar7 = p->nTruth6Words[(byte)pCut->field_0x1f];
    if ((uVar9 & 1) == 0) {
      if (0 < (int)uVar7) {
        uVar8 = 0;
        do {
          pwVar2[uVar8] = pwVar6[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
    }
    else if (0 < (int)uVar7) {
      uVar8 = 0;
      do {
        pwVar2[uVar8] = ~pwVar6[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
    pVVar3 = p->vTtMem[(byte)pCut->field_0x1f];
    if (pVVar3 == (Vec_Mem_t *)0x0) {
      pwVar6 = (word *)0x0;
    }
    else {
      uVar7 = uVar9 >> 1;
      if (pVVar3->nEntries <= (int)uVar7) goto LAB_00301198;
      pwVar6 = pVVar3->ppPages[uVar7 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
               (ulong)(uVar7 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
    }
    uVar7 = p->nTruth6Words[(byte)pCut->field_0x1f];
    if ((uVar9 & 1) == 0) {
      if (0 < (int)uVar7) {
        uVar8 = 0;
        do {
          pwVar2[uVar8] = pwVar6[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
    }
    else if (0 < (int)uVar7) {
      uVar8 = 0;
      do {
        pwVar2[uVar8] = ~pwVar6[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
    uVar7 = 1 << ((char)(*(uint *)&pCut->field_0x1c >> 0x18) - 5U & 0x1f);
    if (*(uint *)&pCut->field_0x1c < 0x6000000) {
      uVar7 = 1;
    }
    if (0 < (int)uVar7) {
      uVar8 = (ulong)uVar7 + 1;
      do {
        puVar1 = (uint *)((long)pwVar2 + uVar8 * 4 + -8);
        *puVar1 = ~*puVar1;
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
      uVar9 = pCut->iCutFunc;
    }
    if ((int)uVar9 < 0) goto LAB_00301179;
    pVVar3 = p->vTtMem[(byte)pCut->field_0x1f];
    if (pVVar3 == (Vec_Mem_t *)0x0) {
      pwVar6 = (word *)0x0;
    }
    else {
      uVar7 = uVar9 >> 1;
      if (pVVar3->nEntries <= (int)uVar7) goto LAB_00301198;
      pwVar6 = pVVar3->ppPages[uVar7 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
               (ulong)(uVar7 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
    }
    uVar7 = p->nTruth6Words[(byte)pCut->field_0x1f];
    if ((uVar9 & 1) == 0) {
      if (0 < (int)uVar7) {
        uVar8 = 0;
        do {
          pwVar2[uVar8] = pwVar6[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
    }
    else if (0 < (int)uVar7) {
      uVar8 = 0;
      do {
        pwVar2[uVar8] = ~pwVar6[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
    uVar7 = Kit_TruthIsop((uint *)pwVar2,(uint)(byte)pCut->field_0x1f,s_vMemory2,0);
    uVar9 = pCut->iCutFunc;
    if ((int)uVar9 < 0) goto LAB_00301179;
    pwVar2 = p->puTempW;
    pVVar3 = p->vTtMem[(byte)pCut->field_0x1f];
    if (pVVar3 == (Vec_Mem_t *)0x0) {
      pwVar6 = (word *)0x0;
    }
    else {
      uVar4 = uVar9 >> 1;
      if (pVVar3->nEntries <= (int)uVar4) goto LAB_00301198;
      pwVar6 = pVVar3->ppPages[uVar4 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
               (ulong)(uVar4 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
    }
    uVar4 = p->nTruth6Words[(byte)pCut->field_0x1f];
    if ((uVar9 & 1) == 0) {
      if (0 < (int)uVar4) {
        uVar8 = 0;
        do {
          pwVar2[uVar8] = pwVar6[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar4 != uVar8);
      }
    }
    else if (0 < (int)uVar4) {
      uVar8 = 0;
      do {
        pwVar2[uVar8] = ~pwVar6[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
    }
    pVVar3 = p->vTtMem[(byte)pCut->field_0x1f];
    if (pVVar3 == (Vec_Mem_t *)0x0) {
      pwVar6 = (word *)0x0;
    }
    else {
      uVar4 = uVar9 >> 1;
      if (pVVar3->nEntries <= (int)uVar4) {
LAB_00301198:
        __assert_fail("i >= 0 && i < p->nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                      ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
      }
      pwVar6 = pVVar3->ppPages[uVar4 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
               (ulong)(uVar4 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
    }
    uVar4 = p->nTruth6Words[(byte)pCut->field_0x1f];
    if ((uVar9 & 1) == 0) {
      if (0 < (int)uVar4) {
        uVar8 = 0;
        do {
          pwVar2[uVar8] = pwVar6[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar4 != uVar8);
      }
    }
    else if (0 < (int)uVar4) {
      uVar8 = 0;
      do {
        pwVar2[uVar8] = ~pwVar6[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
    }
    uVar9 = 1 << ((char)(*(uint *)&pCut->field_0x1c >> 0x18) - 5U & 0x1f);
    if (*(uint *)&pCut->field_0x1c < 0x6000000) {
      uVar9 = 1;
    }
    if (0 < (int)uVar9) {
      uVar8 = (ulong)uVar9 + 1;
      do {
        puVar1 = (uint *)((long)pwVar2 + uVar8 * 4 + -8);
        *puVar1 = ~*puVar1;
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
    }
    if (uVar7 != 0xffffffff) {
      if (1 < uVar7) {
        __assert_fail("RetValue == 0 || RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRenode.c"
                      ,0x132,"int Abc_NtkRenodeEvalMv(If_Man_t *, If_Cut_t *)");
      }
      iVar5 = Abc_NodeEvalMvCost((uint)(byte)pCut->field_0x1f,s_vMemory,s_vMemory2);
      if (iVar5 < 0xfff) {
        return iVar5;
      }
      return 0xfff;
    }
  }
  return 0xfff;
}

Assistant:

int Abc_NtkRenodeEvalMv( If_Man_t * p, If_Cut_t * pCut )
{
    char * pPerm = If_CutPerm( pCut );
    int i, RetValue;
    // set internal mapper parameters
    for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        pPerm[i] = 1;
    // compute ISOP for the positive phase
    RetValue = Kit_TruthIsop( If_CutTruth(p, pCut), If_CutLeaveNum(pCut), s_vMemory, 0 );
    if ( RetValue == -1 )
        return IF_COST_MAX;
    assert( RetValue == 0 || RetValue == 1 );
    // compute ISOP for the negative phase
    Kit_TruthNot( If_CutTruth(p, pCut), If_CutTruth(p, pCut), If_CutLeaveNum(pCut) );
    RetValue = Kit_TruthIsop( If_CutTruth(p, pCut), If_CutLeaveNum(pCut), s_vMemory2, 0 );
    Kit_TruthNot( If_CutTruth(p, pCut), If_CutTruth(p, pCut), If_CutLeaveNum(pCut) );
    if ( RetValue == -1 )
        return IF_COST_MAX;
    assert( RetValue == 0 || RetValue == 1 );
    // return the cost of the cut 
    RetValue = Abc_NodeEvalMvCost( If_CutLeaveNum(pCut), s_vMemory, s_vMemory2 );
    if ( RetValue >= IF_COST_MAX )
        return IF_COST_MAX;
    return RetValue;
}